

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::ninjaCmd_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this)

{
  const_reference ppcVar1;
  allocator local_21;
  value_type local_20;
  cmLocalGenerator *lgen;
  cmGlobalNinjaGenerator *this_local;
  
  lgen = (cmLocalGenerator *)this;
  this_local = (cmGlobalNinjaGenerator *)__return_storage_ptr__;
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                        LocalGenerators,0);
  local_20 = *ppcVar1;
  if (local_20 == (value_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"ninja",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    cmOutputConverter::ConvertToOutputFormat
              (__return_storage_ptr__,&local_20->super_cmOutputConverter,&this->NinjaCommand,SHELL);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ninjaCmd() const
{
  cmLocalGenerator* lgen = this->LocalGenerators[0];
  if (lgen) {
    return lgen->ConvertToOutputFormat(this->NinjaCommand,
                                       cmLocalGenerator::SHELL);
  }
  return "ninja";
}